

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

FILE * Minisat::read_pipe(char *fmt,int *sig,char *path)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  FILE *pFVar4;
  int *piVar5;
  stat buf;
  stat local_c0;
  
  if (((path == (char *)0x0) || (iVar2 = stat(path,&local_c0), iVar2 != 0)) ||
     (iVar2 = access(path,4), iVar2 != 0)) {
    return (FILE *)0x0;
  }
  if (sig != (int *)0x0) {
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      return (FILE *)0x0;
    }
    if (*sig == -1) {
      fclose(__stream);
    }
    else {
      piVar5 = sig + 1;
      do {
        iVar3 = getc(__stream);
        iVar2 = piVar5[-1];
        if (iVar3 != iVar2) {
          fclose(__stream);
          return (FILE *)0x0;
        }
        iVar1 = *piVar5;
        piVar5 = piVar5 + 1;
      } while (iVar1 != -1);
      fclose(__stream);
      if (iVar3 != iVar2) {
        return (FILE *)0x0;
      }
    }
  }
  pFVar4 = open_pipe(fmt,path,"r");
  return pFVar4;
}

Assistant:

inline bool file_readable(const char *path)
{
    if (!path) return false;
    struct stat buf;
    if (stat(path, &buf)) return false;
    if (access(path, R_OK)) return false;
    return true;
}